

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

void __thiscall
tchecker::system::system_builder_t::visit(system_builder_t *this,sync_declaration_t *d)

{
  pointer psVar1;
  system_t *psVar2;
  invalid_argument *this_00;
  pointer psVar3;
  event_id_t event;
  process_id_t pid;
  vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  v;
  uint local_90;
  process_id_t local_8c;
  vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  local_88;
  sync_declaration_t *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  local_68;
  
  local_88.
  super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar3 = (d->_syncs).
           super__Vector_base<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (d->_syncs).
           super__Vector_base<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = d;
  if (psVar3 != psVar1) {
    do {
      local_8c = processes_t::process_id
                           (&this->_system->super_processes_t,
                            &((((psVar3->
                                super___shared_ptr<tchecker::parsing::sync_constraint_t,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->_process).
                              super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name);
      psVar2 = this->_system;
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&local_68,(key_type *)&(psVar2->super_events_t)._events_index);
      if ((pointer)CONCAT44(local_68._M_buckets._4_4_,(sync_strength_t)local_68._M_buckets) ==
          (psVar2->super_events_t)._events_index._key_map.m_flat_tree.m_data.m_seq.m_holder.m_start
          + *(stored_size_type *)
             ((long)&(psVar2->super_events_t)._events_index._key_map.m_flat_tree.m_data.m_seq.
                     m_holder + 8)) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"key is not indexed");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      local_90 = ((pointer)CONCAT44(local_68._M_buckets._4_4_,(sync_strength_t)local_68._M_buckets))
                 ->second;
      local_68._M_buckets._0_4_ =
           ((psVar3->
            super___shared_ptr<tchecker::parsing::sync_constraint_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->_strength;
      std::
      vector<tchecker::system::sync_constraint_t,std::allocator<tchecker::system::sync_constraint_t>>
      ::emplace_back<unsigned_int&,unsigned_int&,tchecker::sync_strength_t>
                ((vector<tchecker::system::sync_constraint_t,std::allocator<tchecker::system::sync_constraint_t>>
                  *)&local_88,&local_8c,&local_90,(sync_strength_t *)&local_68);
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  psVar2 = this->_system;
  attributes_t::attributes_t
            ((attributes_t *)&local_68,
             &(local_70->super_inner_declaration_t).super_declaration_t._attr);
  system_t::add_synchronization(psVar2,&local_88,(attributes_t *)&local_68);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable(&local_68);
  if (local_88.
      super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual void visit(tchecker::parsing::sync_declaration_t const & d)
  {
    std::vector<tchecker::system::sync_constraint_t> v;
    for (std::shared_ptr<tchecker::parsing::sync_constraint_t> const & c : d.sync_constraints()) {
      tchecker::process_id_t pid = _system.process_id(c->process().name());
      tchecker::event_id_t event = _system.event_id(c->event().name());
      v.emplace_back(pid, event, c->strength());
    }

    _system.add_synchronization(v, d.attributes());
  }